

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::is_tessellating_triangles(Compiler *this)

{
  bool bVar1;
  Bitset *this_00;
  Compiler *this_local;
  
  this_00 = get_execution_mode_bitset(this);
  bVar1 = Bitset::get(this_00,0x16);
  return bVar1;
}

Assistant:

bool Compiler::is_tessellating_triangles() const
{
	return get_execution_mode_bitset().get(ExecutionModeTriangles);
}